

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_open16(void *zFilename,sqlite3 **ppDb)

{
  uint uVar1;
  sqlite3_value *psVar2;
  void *pvVar3;
  long *in_RSI;
  char *in_RDI;
  int rc;
  sqlite3_value *pVal;
  char *zFilename8;
  undefined7 in_stack_ffffffffffffffc8;
  u8 in_stack_ffffffffffffffcf;
  uint in_stack_ffffffffffffffd0;
  sqlite3_value *v;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  v = (sqlite3_value *)&DAT_aaaaaaaaaaaaaaaa;
  *in_RSI = 0;
  uVar1 = sqlite3_initialize();
  if (uVar1 == 0) {
    if ((sqlite3 **)in_RDI == (sqlite3 **)0x0) {
      in_RDI = "";
    }
    psVar2 = sqlite3ValueNew((sqlite3 *)(ulong)in_stack_ffffffffffffffd0);
    sqlite3ValueSetStr(v,(int)((ulong)psVar2 >> 0x20),
                       (void *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcf,
                       (_func_void_void_ptr *)0x14d781);
    pvVar3 = sqlite3ValueText((sqlite3_value *)
                              CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),'\0');
    if (pvVar3 == (void *)0x0) {
      uVar1 = 7;
    }
    else {
      uVar1 = openDatabase((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (sqlite3 **)in_RDI,zFilename8._4_4_,(char *)in_RSI);
      if ((uVar1 == 0) &&
         ((*(ushort *)(*(long *)(*(long *)(*in_RSI + 0x20) + 0x18) + 0x72) & 1) != 1)) {
        *(undefined1 *)(*in_RSI + 100) = 2;
        *(undefined1 *)(*(long *)(*(long *)(*in_RSI + 0x20) + 0x18) + 0x71) = 2;
      }
    }
    sqlite3ValueFree((sqlite3_value *)0x14d810);
    uVar1 = uVar1 & 0xff;
  }
  return uVar1;
}

Assistant:

SQLITE_API int sqlite3_open16(
  const void *zFilename,
  sqlite3 **ppDb
){
  char const *zFilename8;   /* zFilename encoded in UTF-8 instead of UTF-16 */
  sqlite3_value *pVal;
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppDb==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppDb = 0;
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
  if( zFilename==0 ) zFilename = "\000\000";
  pVal = sqlite3ValueNew(0);
  sqlite3ValueSetStr(pVal, -1, zFilename, SQLITE_UTF16NATIVE, SQLITE_STATIC);
  zFilename8 = sqlite3ValueText(pVal, SQLITE_UTF8);
  if( zFilename8 ){
    rc = openDatabase(zFilename8, ppDb,
                      SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE, 0);
    assert( *ppDb || rc==SQLITE_NOMEM );
    if( rc==SQLITE_OK && !DbHasProperty(*ppDb, 0, DB_SchemaLoaded) ){
      SCHEMA_ENC(*ppDb) = ENC(*ppDb) = SQLITE_UTF16NATIVE;
    }
  }else{
    rc = SQLITE_NOMEM_BKPT;
  }
  sqlite3ValueFree(pVal);

  return rc & 0xff;
}